

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

void Fxu_HeapSingleMoveDn(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single *pFVar1;
  Fxu_Single **ppFVar2;
  uint uVar3;
  Fxu_Single **pSingle1;
  Fxu_Single **pSingle2;
  
  pSingle1 = p->pTree + pSingle->HNum;
  do {
    pFVar1 = *pSingle1;
    uVar3 = pFVar1->HNum * 2;
    if (p->nItems < (int)uVar3) {
      return;
    }
    ppFVar2 = p->pTree;
    pSingle2 = ppFVar2 + (int)uVar3;
    if ((int)uVar3 < p->nItems) {
      if (((*pSingle2)->Weight <= pFVar1->Weight) &&
         (ppFVar2[(int)(uVar3 | 1)]->Weight <= pFVar1->Weight)) {
        return;
      }
      if ((*pSingle2)->Weight < ppFVar2[(int)(uVar3 | 1)]->Weight) {
        pSingle2 = ppFVar2 + (int)(uVar3 | 1);
      }
    }
    else if ((*pSingle2)->Weight <= pFVar1->Weight) {
      return;
    }
    Fxu_HeapSingleSwap(pSingle1,pSingle2);
    pSingle1 = pSingle2;
  } while( true );
}

Assistant:

void Fxu_HeapSingleMoveDn( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    Fxu_Single ** ppChild1, ** ppChild2, ** ppSingle;
    ppSingle = &FXU_HEAP_SINGLE_CURRENT(p, pSingle);
    while ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,*ppSingle) )
    { // if Child1 does not exist, Child2 also does not exists

        // get the children
        ppChild1 = &FXU_HEAP_SINGLE_CHILD1(p,*ppSingle);
        if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,*ppSingle) )
        {
            ppChild2 = &FXU_HEAP_SINGLE_CHILD2(p,*ppSingle);

            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
            { // Var is larger than both, skip
                break;
            }
            else
            { // Var is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_SINGLE_WEIGHT(*ppChild1) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                    // update the pointer
                    ppSingle = ppChild1;
                }
                else
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild2 );
                    // update the pointer
                    ppSingle = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) )
            { // Var is larger than Child1, skip
                break;
            }
            else
            { // Var is smaller than Child1, then swap them
                Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                // update the pointer
                ppSingle = ppChild1;
            }
        }
    }
}